

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O2

void __thiscall RenX::ExemptionDatabase::upgrade_database(ExemptionDatabase *this)

{
  pointer puVar1;
  FILE *__stream;
  size_t in_RCX;
  long lVar2;
  
  __stream = fopen((this->m_filename)._M_dataplus._M_p,"wb");
  if (__stream != (FILE *)0x0) {
    (**(code **)(*(long *)this + 0x10))(this,__stream);
    lVar2 = 0;
    while (puVar1 = (this->m_entries).
                    super__Vector_base<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          (this->m_entries).
          super__Vector_base<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
      write(this,(int)*(undefined8 *)
                       ((long)&(puVar1->_M_t).
                               super___uniq_ptr_impl<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_RenX::ExemptionDatabase::Entry_*,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
                               .super__Head_base<0UL,_RenX::ExemptionDatabase::Entry_*,_false>.
                               _M_head_impl + lVar2),__stream,in_RCX);
      lVar2 = lVar2 + 8;
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void RenX::ExemptionDatabase::upgrade_database() {
	FILE *file = fopen(m_filename.c_str(), "wb");
	if (file != nullptr) {
		this->create_header(file);
		for (size_t index = 0; m_entries.size(); ++index) {
			write(m_entries[index].get(), file);
		}

		fclose(file);
	}
}